

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void t2_hints_stems(T2_Hints hints,FT_UInt dimension,FT_Int count,FT_Fixed *coords)

{
  FT_Fixed FVar1;
  int local_138;
  int local_134;
  FT_Int n;
  FT_Int total;
  FT_Pos y;
  FT_Pos stems [32];
  FT_Fixed *coords_local;
  FT_Int count_local;
  FT_UInt dimension_local;
  T2_Hints hints_local;
  
  _n = 0;
  for (local_134 = count; 0 < local_134; local_134 = local_134 - (int)coords_local) {
    coords_local._0_4_ = local_134;
    if (0x10 < local_134) {
      coords_local._0_4_ = 0x10;
    }
    for (local_138 = 0;
        SBORROW4(local_138,(int)coords_local * 2) != local_138 + (int)coords_local * -2 < 0;
        local_138 = local_138 + 1) {
      _n = _n + coords[local_138];
      FVar1 = FT_RoundFix(_n);
      stems[(long)local_138 + -1] = FVar1 >> 0x10;
    }
    for (local_138 = 0;
        SBORROW4(local_138,(int)coords_local * 2) != local_138 + (int)coords_local * -2 < 0;
        local_138 = local_138 + 2) {
      stems[(long)(local_138 + 1) + -1] =
           stems[(long)(local_138 + 1) + -1] - stems[(long)local_138 + -1];
    }
    ps_hints_stem((PS_Hints)hints,dimension,(int)coords_local,&y);
  }
  return;
}

Assistant:

static void
  t2_hints_stems( T2_Hints   hints,
                  FT_UInt    dimension,
                  FT_Int     count,
                  FT_Fixed*  coords )
  {
    FT_Pos  stems[32], y;
    FT_Int  total = count, n;


    y = 0;
    while ( total > 0 )
    {
      /* determine number of stems to write */
      count = total;
      if ( count > 16 )
        count = 16;

      /* compute integer stem positions in font units */
      for ( n = 0; n < count * 2; n++ )
      {
        y        = ADD_LONG( y, coords[n] );
        stems[n] = FIXED_TO_INT( y );
      }

      /* compute lengths */
      for ( n = 0; n < count * 2; n += 2 )
        stems[n + 1] = stems[n + 1] - stems[n];

      /* add them to the current dimension */
      ps_hints_stem( (PS_Hints)hints, dimension, count, stems );

      total -= count;
    }
  }